

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O2

QMap<QByteArray,_QVariant> __thiscall
QSslConfiguration::backendConfiguration(QSslConfiguration *this)

{
  QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
  *pQVar1;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
  in_RDI;
  
  pQVar1 = (((this->d).d.ptr)->backendConfig).d.d.ptr;
  *(QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
    **)in_RDI.d.ptr = pQVar1;
  if (pQVar1 != (QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
                 *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int> =
         (QAtomicInteger<int>)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int> + 1);
    UNLOCK();
  }
  return (QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
            )in_RDI.d.ptr;
}

Assistant:

QMap<QByteArray, QVariant> QSslConfiguration::backendConfiguration() const
{
    return d->backendConfig;
}